

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pru_impl.cpp
# Opt level: O1

void __thiscall ui::Pru::Fetch(Pru *this)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char cVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  path local_228 [13];
  
  paVar1 = &local_248.field_2;
  pcVar3 = (this->path_)._M_dataplus._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  std::ifstream::ifstream(local_228,(string *)&local_248,_S_in);
  std::operator>>((istream *)local_228,(string *)&this->name_);
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->path_)._M_dataplus._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  std::ifstream::ifstream(local_228,(string *)&local_248,_S_in);
  __rhs = &this->firmware_;
  std::operator>>((istream *)local_228,(string *)__rhs);
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->path_)._M_dataplus._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  std::ifstream::ifstream(local_228,(string *)&local_248,_S_in);
  std::operator>>((istream *)local_228,(string *)&this->state_);
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_248,"/lib/firmware/",__rhs);
  std::filesystem::__cxx11::path::path(local_228,&local_248,auto_format);
  cVar4 = std::filesystem::status(local_228);
  std::filesystem::__cxx11::path::~path(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((cVar4 == '\0') || (cVar4 == -1)) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->info_,0,(char *)(this->info_)._M_string_length,0x1590e4);
  }
  else {
    std::operator+(&local_248,"/lib/firmware/",__rhs);
    std::filesystem::__cxx11::path::path(local_228,&local_248,auto_format);
    lVar5 = std::filesystem::file_size(local_228);
    std::filesystem::__cxx11::path::~path(local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (lVar5 == 0) {
      std::operator+(&local_248," Warning: ",__rhs);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
      paVar2 = &local_228[0]._M_pathname.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_228[0]._M_pathname.field_2._0_8_ = *psVar7;
        local_228[0]._M_pathname.field_2._8_8_ = plVar6[3];
        local_228[0]._M_pathname._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_228[0]._M_pathname.field_2._0_8_ = *psVar7;
        local_228[0]._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_228[0]._M_pathname._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->info_,(string *)local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228[0]._M_pathname._M_dataplus._M_p != paVar2) {
        operator_delete(local_228[0]._M_pathname._M_dataplus._M_p,
                        local_228[0]._M_pathname.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_p = local_248._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p == paVar1) {
        return;
      }
    }
    else {
      std::operator+(&local_228[0]._M_pathname," Loaded Firmware: ",__rhs);
      std::__cxx11::string::operator=((string *)&this->info_,(string *)local_228);
      local_248.field_2._M_allocated_capacity =
           local_228[0]._M_pathname.field_2._M_allocated_capacity;
      _Var8._M_p = local_228[0]._M_pathname._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228[0]._M_pathname._M_dataplus._M_p == &local_228[0]._M_pathname.field_2) {
        return;
      }
    }
    operator_delete(_Var8._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/name") >> name_;
    std::ifstream(path_ + "/firmware") >> firmware_;
    std::ifstream(path_ + "/state") >> state_;
    if (std::filesystem::exists("/lib/firmware/" + firmware_)) {
      if (std::filesystem::file_size("/lib/firmware/" + firmware_) == 0) {
        info_ = " Warning: " + firmware_ + " Empty";
      } else {
        info_ = " Loaded Firmware: " + firmware_;
      }
    } else {
      info_ = " Firmware Not found / Not Supported";
    }
  }